

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall
mjs::switch_statement::switch_statement
          (switch_statement *this,source_extend *extend,expression_ptr *e,clause_list *cl)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  uint32_t uVar3;
  
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__syntax_node_001d7118;
  (this->super_statement).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->super_statement).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  uVar3 = extend->end;
  (this->super_statement).super_syntax_node.extend_.start = extend->start;
  (this->super_statement).super_syntax_node.extend_.end = uVar3;
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__switch_statement_001d7820;
  (this->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t
  .super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (e->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
       super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (e->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  pcVar2 = (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>._M_impl.
  super__Vector_impl_data._M_start =
       (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>._M_impl.
  super__Vector_impl_data._M_finish = pcVar2;
  (this->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (cl->super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl != (expression *)0x0) {
    return;
  }
  __assert_fail("e_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x353,
                "mjs::switch_statement::switch_statement(const source_extend &, expression_ptr &&, clause_list &&)"
               );
}

Assistant:

syntax_node(const source_extend& extend) : extend_(extend) {
    }